

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_space.cpp
# Opt level: O3

ssize_t __thiscall Memory_space::write(Memory_space *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  Memory_space *in_RAX;
  uint8_t *puVar2;
  size_t data_size;
  uint uVar3;
  uint8_t *data_ptr;
  Page_entry *pPVar4;
  ulong __n_00;
  uint uVar5;
  
  if (__n != 0) {
    uVar3 = this->page_mask & __fd;
    uVar5 = (uint)__fd >> ((byte)this->page_bits & 0x1f) & this->page_table_mask;
    do {
      __n_00 = (ulong)(this->page_size - uVar3);
      if (__n < __n_00) {
        __n_00 = __n;
      }
      pPVar4 = this->page_table;
      bVar1 = *(byte *)(pPVar4 + uVar5);
      if ((bVar1 & 1) == 0) {
        puVar2 = (uint8_t *)calloc((ulong)this->page_size,1);
        pPVar4[uVar5].data = puVar2;
        *(byte *)(pPVar4 + uVar5) = bVar1 | 1;
        pPVar4 = this->page_table;
      }
      memcpy(pPVar4[uVar5].data + uVar3,__buf,__n_00);
      __buf = (void *)((long)__buf + __n_00);
      uVar5 = uVar5 + 1 & this->page_table_mask;
      uVar3 = 0;
      __n = __n - __n_00;
      in_RAX = this;
    } while (__n != 0);
  }
  return (ssize_t)in_RAX;
}

Assistant:

void Memory_space::write(uint32_t address, uint8_t *data, size_t size)
{
	unsigned page_index = (address >> page_bits) & page_table_mask;
	unsigned byte_offset = address & page_mask;
	size_t data_size = size;
	uint8_t *data_ptr = data;
	while ( data_size > 0 ) {
		size_t nbytes = min(data_size, (size_t)(page_size - byte_offset));
		if (!page_table[page_index].present) {
			page_table[page_index].data = (uint8_t*)calloc(page_size, 1);
			page_table[page_index].present = 1;
		}
		memcpy(page_table[page_index].data + byte_offset, data_ptr, nbytes);
		data_size -= nbytes;
		data_ptr += nbytes;
		page_index = (page_index + 1) & page_table_mask;
		byte_offset = 0;
	}
}